

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void savemonchn(memfile *mf,monst *mtmp)

{
  monst *pmVar1;
  int local_24;
  monst *pmStack_20;
  uint count;
  monst *mtmp2;
  monst *mtmp_local;
  memfile *mf_local;
  
  local_24 = 0;
  mfmagic_set(mf,0x4e48434d);
  for (pmStack_20 = mtmp; pmStack_20 != (monst *)0x0; pmStack_20 = pmStack_20->nmon) {
    local_24 = local_24 + 1;
  }
  mwrite32(mf,local_24);
  pmVar1 = mtmp;
  while (mtmp2 = pmVar1, mtmp2 != (monst *)0x0) {
    pmVar1 = mtmp2->nmon;
    save_mon(mf,mtmp2);
    if (mtmp2->minvent != (obj *)0x0) {
      saveobjchn(mf,mtmp2->minvent);
    }
  }
  return;
}

Assistant:

static void savemonchn(struct memfile *mf, struct monst *mtmp)
{
	struct monst *mtmp2;
	unsigned int count = 0;
	
	mfmagic_set(mf, MONCHAIN_MAGIC);
	for (mtmp2 = mtmp; mtmp2; mtmp2 = mtmp2->nmon)
	    count++;
	mwrite32(mf, count);

	while (mtmp) {
	    mtmp2 = mtmp->nmon;
	    save_mon(mf, mtmp);
	    
	    if (mtmp->minvent)
		saveobjchn(mf, mtmp->minvent);
	    mtmp = mtmp2;
	}
}